

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O1

void __thiscall pbrt::SquareMatrix<3>::SquareMatrix(SquareMatrix<3> *this,Float (*mat) [3])

{
  int i;
  long lVar1;
  int j;
  long lVar2;
  
  lVar1 = 0;
  do {
    lVar2 = 0;
    do {
      (*(Float (*) [3])*(Float (*) [3])this)[lVar2] = (*mat)[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    lVar1 = lVar1 + 1;
    mat = mat + 1;
    this = (SquareMatrix<3> *)((long)this + 0xc);
  } while (lVar1 != 3);
  return;
}

Assistant:

PBRT_CPU_GPU
    SquareMatrix(const Float mat[N][N]) {
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j)
                m[i][j] = mat[i][j];
    }